

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# primecandidate.c
# Opt level: O0

void pcs_require_residue(PrimeCandidateSource *s,mp_int *mod,mp_int *res_orig)

{
  mp_int *res;
  mp_int *res_reduced;
  mp_int *res_orig_local;
  mp_int *mod_local;
  PrimeCandidateSource *s_local;
  
  res = mp_mod(res_orig,mod);
  pcs_require_residue_inner(s,mod,res);
  mp_free(res);
  return;
}

Assistant:

void pcs_require_residue(PrimeCandidateSource *s,
                         mp_int *mod, mp_int *res_orig)
{
    /*
     * Reduce the input residue to its least non-negative value, in
     * case it was given as a larger equivalent value.
     */
    mp_int *res_reduced = mp_mod(res_orig, mod);
    pcs_require_residue_inner(s, mod, res_reduced);
    mp_free(res_reduced);
}